

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O0

Mat_<double> * mel_to_hz(Mat_<double> *__return_storage_ptr__,Mat_<double> *mels,bool htk)

{
  bool *pbVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  int local_504;
  Mat local_500 [4];
  int i;
  undefined1 local_3a0 [8];
  Mat_<bool> log_t;
  double logstep;
  double min_log_mel;
  double min_log_hz;
  Scalar_<double> local_318;
  Mat local_2f8 [352];
  MatExpr local_198 [359];
  byte local_31;
  double local_30;
  double f_sp;
  double f_min;
  Mat_<double> *pMStack_18;
  bool htk_local;
  Mat_<double> *mels_local;
  Mat_<double> *freqs;
  
  f_sp = 0.0;
  local_30 = 66.66666666666667;
  local_31 = 0;
  f_min._7_1_ = htk;
  pMStack_18 = mels;
  mels_local = __return_storage_ptr__;
  cv::operator*(local_2f8,66.66666666666667);
  cv::Scalar_<double>::Scalar_(&local_318,f_sp);
  cv::operator+(local_198,(Scalar_ *)local_2f8);
  cv::Mat_<double>::Mat_(__return_storage_ptr__,local_198);
  cv::MatExpr::~MatExpr(local_198);
  cv::MatExpr::~MatExpr((MatExpr *)local_2f8);
  dVar3 = (1000.0 - f_sp) / local_30;
  dVar4 = log(6.4);
  log_t._88_8_ = dVar4 / 27.0;
  cv::operator>=(local_500,dVar3);
  cv::Mat_<bool>::Mat_((Mat_<bool> *)local_3a0,(MatExpr *)local_500);
  cv::MatExpr::~MatExpr((MatExpr *)local_500);
  for (local_504 = 0; local_504 < (int)log_t._4_4_; local_504 = local_504 + 1) {
    pbVar1 = cv::Mat_<bool>::operator()((Mat_<bool> *)local_3a0,0,local_504);
    if ((*pbVar1 & 1U) != 0) {
      pdVar2 = cv::Mat_<double>::operator()(mels,0,local_504);
      dVar4 = exp((*pdVar2 - dVar3) * (double)log_t._88_8_);
      pdVar2 = cv::Mat_<double>::operator()(__return_storage_ptr__,0,local_504);
      *pdVar2 = dVar4 * 1000.0;
    }
  }
  local_31 = 1;
  cv::Mat_<bool>::~Mat_((Mat_<bool> *)local_3a0);
  if ((local_31 & 1) == 0) {
    cv::Mat_<double>::~Mat_(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> mel_to_hz(cv::Mat_<double> mels, bool htk = false) {
//    if (htk) {
//        return //python://700.0 * (10.0**(mels / 2595.0) - 1.0);
//    }
    // Fill in the linear scale
    double f_min = 0.0;
    double f_sp = 200.0 / 3;
    cv::Mat_<double> freqs = mels * f_sp + f_min;
    // And now the nonlinear scale
    double min_log_hz = 1000.0;                         // beginning of log region (Hz)
    double min_log_mel = (min_log_hz - f_min) / f_sp;   // same (Mels)
    double logstep = log(6.4) / 27.0;              // step size for log region
    // 对照Python平台的librosa库，移植
    //if (mels.ndim) {
    // If we have vector data, vectorize
    cv::Mat_<bool> log_t = (mels >= min_log_mel);
    for (int i = 0; i < log_t.cols; i++) {
        if (log_t(0, i)) {
            freqs(0, i) = cv::exp((mels(0, i) - min_log_mel) * logstep) * min_log_hz;
        }
    }
    //}
    return freqs;
}